

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPUDPv4Transmitter::SetMulticastTTL(RTPUDPv4Transmitter *this,uint8_t ttl)

{
  int iVar1;
  uint local_20;
  int status;
  int ttl2;
  uint8_t ttl_local;
  RTPUDPv4Transmitter *this_local;
  
  local_20 = (uint)ttl;
  status._3_1_ = ttl;
  _ttl2 = this;
  iVar1 = setsockopt(this->rtpsock,0,0x21,&local_20,4);
  if (iVar1 == 0) {
    if ((this->rtpsock == this->rtcpsock) ||
       (iVar1 = setsockopt(this->rtcpsock,0,0x21,&local_20,4), iVar1 == 0)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPUDPv4Transmitter::SetMulticastTTL(uint8_t ttl)
{
	int ttl2,status;

	ttl2 = (int)ttl;
	status = setsockopt(rtpsock,IPPROTO_IP,IP_MULTICAST_TTL,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;

	if (rtpsock != rtcpsock) // no need to set TTL twice when multiplexing
	{
		status = setsockopt(rtcpsock,IPPROTO_IP,IP_MULTICAST_TTL,(const char *)&ttl2,sizeof(int));
		if (status != 0)
			return false;
	}
	return true;
}